

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_InitParticles(void)

{
  int iVar1;
  char *__nptr;
  int iVar2;
  
  __nptr = DArgs::CheckValue(Args,"-numparticles");
  iVar1 = r_maxparticles.Value;
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
  }
  iVar2 = 0xffff;
  if (iVar1 < 0xffff) {
    iVar2 = iVar1;
  }
  NumParticles = 100;
  if (100 < iVar2) {
    NumParticles = (WORD)iVar2;
  }
  P_DeinitParticles();
  Particles = (particle_t *)operator_new__((ulong)NumParticles << 7);
  P_ClearParticles();
  addterm(P_DeinitParticles,"P_DeinitParticles");
  return;
}

Assistant:

void P_InitParticles ()
{
	const char *i;
	int num;

	if ((i = Args->CheckValue ("-numparticles")))
		num = atoi (i);
	// [BC] Use r_maxparticles now.
	else
		num = r_maxparticles;

	// This should be good, but eh...
	NumParticles = (WORD)clamp<int>(num, 100, 65535);

	P_DeinitParticles();
	Particles = new particle_t[NumParticles];
	P_ClearParticles ();
	atterm (P_DeinitParticles);
}